

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O3

QVariant * __thiscall
QGenericItemModel::headerData
          (QVariant *__return_storage_ptr__,QGenericItemModel *this,int section,
          Orientation orientation,int role)

{
  undefined8 *puVar1;
  long in_FS_OFFSET;
  int local_3c;
  Orientation local_38;
  int local_34;
  int *local_30;
  Orientation *local_28;
  int *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &local_34;
  local_28 = &local_38;
  local_30 = &local_3c;
  puVar1 = *(undefined8 **)(this + 0x10);
  (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
  *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  local_3c = role;
  local_38 = orientation;
  local_34 = section;
  (*(code *)*puVar1)(6,puVar1,__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGenericItemModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    return impl->callConst<QVariant>(QGenericItemModelImplBase::HeaderData,
                                     section, orientation, role);
}